

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O3

bool caffe::NetNeedsBatchNormUpgrade(NetParameter *net_param)

{
  int iVar1;
  Type *pTVar2;
  int index;
  
  index = 0;
  if (0 < (net_param->layer_).super_RepeatedPtrFieldBase.current_size_) {
    do {
      pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&(net_param->layer_).super_RepeatedPtrFieldBase,index);
      iVar1 = std::__cxx11::string::compare((char *)(pTVar2->type_).ptr_);
      if (iVar1 == 0) {
        pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                           (&(net_param->layer_).super_RepeatedPtrFieldBase,index);
        if ((pTVar2->param_).super_RepeatedPtrFieldBase.current_size_ == 3) {
          index = 1;
          goto LAB_0042a6c2;
        }
      }
      index = index + 1;
    } while (index < (net_param->layer_).super_RepeatedPtrFieldBase.current_size_);
    index = 0;
  }
LAB_0042a6c2:
  return SUB41(index,0);
}

Assistant:

bool NetNeedsBatchNormUpgrade(const NetParameter& net_param) {
  for (int i = 0; i < net_param.layer_size(); ++i) {
    // Check if BatchNorm layers declare three parameters, as required by
    // the previous BatchNorm layer definition.
    if (net_param.layer(i).type() == "BatchNorm"
        && net_param.layer(i).param_size() == 3) {
      return true;
    }
  }
  return false;
}